

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_result_builder.h
# Opt level: O0

void __thiscall Catch::ResultBuilder::ExprComponents::~ExprComponents(ExprComponents *this)

{
  ExprComponents *this_local;
  
  std::__cxx11::string::~string((string *)&this->op);
  std::__cxx11::string::~string((string *)&this->rhs);
  std::__cxx11::string::~string((string *)&this->lhs);
  return;
}

Assistant:

ExprComponents() : testFalse( false ) {}